

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O1

int ncnn::deconvolution(Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
                       int kernel_h,int stride_w,int stride_h,int dilation_w,int dilation_h,
                       int activation_type,Mat *activation_params,Option *opt)

{
  float fVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  bool bVar7;
  long lVar8;
  pointer piVar9;
  uint uVar10;
  uint uVar11;
  int extraout_EAX;
  ulong extraout_RAX;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  void *pvVar15;
  float *pfVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  Mat *pMVar21;
  bool bVar22;
  undefined4 uVar23;
  float fVar24;
  undefined1 auVar25 [16];
  int iVar27;
  undefined1 auVar26 [16];
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int size;
  vector<int,_std::allocator<int>_> _space_ofs;
  allocator_type local_119;
  float *local_118;
  ulong local_110;
  Mat *local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  void *local_e8;
  int local_dc;
  undefined1 local_d8 [16];
  ulong local_c0;
  ulong local_b8;
  Mat *local_b0;
  ulong local_a8;
  void *local_a0;
  void *local_98;
  Mat *local_90;
  ulong local_88;
  ulong local_80;
  long local_78;
  long local_70;
  void *local_68;
  long local_60;
  undefined1 local_58 [16];
  vector<int,_std::allocator<int>_> local_48;
  
  iVar27 = top_blob->w;
  local_c0 = (ulong)(uint)top_blob->c;
  uVar10 = kernel_h * kernel_w;
  local_108 = bias_data;
  local_b0 = bottom_blob;
  local_90 = weight_data;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,(long)(int)uVar10,&local_119);
  piVar9 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar12 = extraout_RAX;
  if (0 < kernel_h) {
    uVar12 = (ulong)(uint)dilation_w;
    iVar13 = 0;
    iVar18 = 0;
    iVar19 = 0;
    do {
      if (0 < kernel_w) {
        lVar20 = 0;
        do {
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar13 + lVar20] = iVar18;
          iVar18 = iVar18 + dilation_w;
          lVar20 = lVar20 + 1;
        } while (kernel_w != (int)lVar20);
        iVar13 = iVar13 + (int)lVar20;
      }
      iVar18 = iVar18 + (iVar27 * dilation_h - dilation_w * kernel_w);
      iVar19 = iVar19 + 1;
    } while (iVar19 != kernel_h);
  }
  if (0 < (int)local_c0) {
    iVar27 = top_blob->w;
    pvVar15 = top_blob->data;
    uVar12 = top_blob->elemsize;
    local_b8 = top_blob->cstep * uVar12;
    lVar20 = (long)top_blob->h * (long)iVar27;
    local_100 = 0;
    local_a0 = local_108->data;
    bVar22 = local_a0 != (void *)0x0;
    iVar13 = local_108->c;
    sVar3 = local_108->cstep;
    iVar18 = (int)((uVar12 * lVar20 + 0xf & 0xfffffffffffffff0) / uVar12);
    if (top_blob->dims == 4) {
      iVar18 = (int)lVar20;
    }
    uVar11 = iVar18 * top_blob->d;
    local_80 = (ulong)uVar11;
    uVar2 = local_b0->c;
    local_f8 = (ulong)(uint)(top_blob->h * iVar27);
    local_60 = (long)stride_w;
    local_70 = (long)stride_h * uVar12 * (long)iVar27;
    local_88 = (ulong)(uVar11 + 3 & 0xfffffffc);
    lVar20 = local_80 - 1;
    auVar30._8_4_ = (int)lVar20;
    auVar30._0_8_ = lVar20;
    auVar30._12_4_ = (int)((ulong)lVar20 >> 0x20);
    local_dc = uVar2 * uVar10;
    auVar30 = auVar30 ^ _DAT_005ef240;
    local_f0 = (ulong)(activation_type - 1);
    local_108 = (Mat *)(ulong)(uint)local_b0->w;
    local_a8 = (ulong)(uint)local_b0->h;
    lVar20 = (long)pvVar15 + 0xc;
    local_110 = 0;
    auVar31 = _DAT_005ef340;
    auVar32 = _DAT_005ef350;
    auVar33 = _DAT_005ef240;
    local_98 = pvVar15;
    local_58 = auVar30;
    do {
      uVar23 = 0;
      if ((long)iVar13 * sVar3 != 0 && bVar22) {
        uVar23 = *(undefined4 *)((long)local_a0 + local_110 * 4);
      }
      if (0 < (int)local_80) {
        uVar12 = 0;
        do {
          auVar25._8_4_ = (int)uVar12;
          auVar25._0_8_ = uVar12;
          auVar25._12_4_ = (int)(uVar12 >> 0x20);
          auVar26 = (auVar25 | auVar32) ^ auVar33;
          iVar18 = auVar30._0_4_;
          bVar7 = iVar18 < auVar26._0_4_;
          iVar27 = auVar26._4_4_;
          iVar19 = auVar30._4_4_;
          if ((bool)(~(iVar19 < iVar27 || iVar27 == iVar19 && bVar7) & 1)) {
            *(undefined4 *)(lVar20 + -0xc + uVar12 * 4) = uVar23;
          }
          if (iVar19 >= iVar27 && (iVar27 != iVar19 || !bVar7)) {
            *(undefined4 *)(lVar20 + -8 + uVar12 * 4) = uVar23;
          }
          auVar25 = (auVar25 | auVar31) ^ auVar33;
          iVar27 = auVar25._4_4_;
          if (iVar27 <= iVar19 && (iVar27 != iVar19 || auVar25._0_4_ <= iVar18)) {
            *(undefined4 *)(lVar20 + -4 + uVar12 * 4) = uVar23;
            *(undefined4 *)(lVar20 + uVar12 * 4) = uVar23;
          }
          uVar12 = uVar12 + 4;
        } while (local_88 != uVar12);
      }
      if (0 < (int)local_a8) {
        local_68 = (void *)(local_b8 * local_110 + (long)local_98);
        local_118 = (float *)((long)(int)local_100 * 4 + (long)local_90->data);
        auVar26._8_8_ = 0;
        auVar26._0_8_ = local_d8._8_8_;
        local_d8 = auVar26 << 0x40;
        do {
          if (0 < (int)local_108) {
            iVar27 = local_b0->w;
            sVar4 = local_b0->elemsize;
            sVar5 = local_b0->cstep;
            pvVar6 = local_b0->data;
            pMVar21 = (Mat *)0x0;
            do {
              if (0 < (int)uVar2) {
                lVar8 = (long)pMVar21 * local_60 * 4 + local_d8._0_8_ * local_70;
                uVar12 = 0;
                pfVar16 = local_118;
                do {
                  if (0 < (int)uVar10) {
                    fVar24 = *(float *)((long)pvVar6 +
                                       sVar5 * sVar4 * uVar12 +
                                       (long)pMVar21 * 4 + (long)iVar27 * local_d8._0_8_ * sVar4);
                    uVar14 = 0;
                    do {
                      *(float *)((long)local_68 + (long)piVar9[uVar14] * 4 + lVar8) =
                           pfVar16[uVar14] * fVar24 +
                           *(float *)((long)local_68 + (long)piVar9[uVar14] * 4 + lVar8);
                      uVar14 = uVar14 + 1;
                    } while (uVar10 != uVar14);
                  }
                  uVar12 = uVar12 + 1;
                  pfVar16 = pfVar16 + (int)uVar10;
                } while (uVar12 != uVar2);
              }
              pMVar21 = (Mat *)((long)&pMVar21->data + 1);
            } while (pMVar21 != local_108);
          }
          uVar12 = local_d8._0_8_ + 1;
          local_d8._0_8_ = uVar12;
        } while (uVar12 != local_a8);
      }
      local_e8 = pvVar15;
      local_78 = lVar20;
      if (0 < (int)local_f8) {
        local_118 = (float *)activation_params->data;
        uVar17 = 0;
        uVar12 = local_f0;
        uVar14 = local_f8;
        do {
          fVar24 = *(float *)((long)pvVar15 + uVar17 * 4);
          fVar29 = fVar24;
          if ((uint)uVar12 < 6) {
            switch((long)&switchD_002991de::switchdataD_005f3d78 +
                   (long)(int)(&switchD_002991de::switchdataD_005f3d78)[uVar12]) {
            case 0x2991e0:
              if (fVar24 <= 0.0) {
                fVar29 = 0.0;
              }
              break;
            case 0x2991f0:
              local_d8 = ZEXT416((uint)fVar24);
              fVar24 = expf(fVar24);
              fVar24 = logf(fVar24 + 1.0);
              fVar24 = tanhf(fVar24);
              pvVar15 = local_e8;
              uVar12 = local_f0;
              uVar14 = local_f8;
              auVar30 = local_58;
              auVar31 = _DAT_005ef340;
              auVar32 = _DAT_005ef350;
              auVar33 = _DAT_005ef240;
              fVar29 = fVar24 * (float)local_d8._0_4_;
              break;
            case 0x299256:
              if (fVar24 <= *local_118) {
                fVar24 = *local_118;
              }
              fVar29 = local_118[1];
              if (fVar24 <= local_118[1]) {
                fVar29 = fVar24;
              }
              break;
            case 0x299275:
              if (88.37626 <= fVar24) {
                fVar24 = 88.37626;
              }
              fVar24 = expf((float)(-(uint)(fVar24 < -88.37626) & 0x42b0c0a5 |
                                   ~-(uint)(fVar24 < -88.37626) & ((uint)fVar24 ^ auVar33._0_4_)));
              pvVar15 = local_e8;
              uVar12 = local_f0;
              uVar14 = local_f8;
              auVar30 = local_58;
              auVar31 = _DAT_005ef340;
              auVar32 = _DAT_005ef350;
              auVar33 = _DAT_005ef240;
              fVar29 = 1.0 / (fVar24 + 1.0);
              break;
            case 0x2992f6:
              fVar29 = (float)(~-(uint)(0.0 < fVar24) & (uint)*local_118 |
                              -(uint)(0.0 < fVar24) & 0x3f800000) * fVar24;
              break;
            case 0x299322:
              fVar1 = *local_118;
              fVar28 = (float)((uint)local_118[1] ^ auVar33._0_4_) / fVar1;
              fVar29 = 0.0;
              if ((fVar28 <= fVar24) && (fVar29 = fVar24, fVar24 <= fVar28 + 1.0 / fVar1)) {
                fVar29 = (fVar1 * fVar24 + local_118[1]) * fVar24;
              }
            }
          }
          *(float *)((long)pvVar15 + uVar17 * 4) = fVar29;
          uVar17 = uVar17 + 1;
        } while (uVar14 != uVar17);
      }
      local_110 = local_110 + 1;
      lVar20 = local_78 + local_b8;
      local_100 = (ulong)(uint)((int)local_100 + local_dc);
      pvVar15 = (void *)((long)pvVar15 + local_b8);
      uVar12 = local_b8;
    } while (local_110 != local_c0);
  }
  iVar27 = (int)uVar12;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    iVar27 = extraout_EAX;
  }
  return iVar27;
}

Assistant:

static int deconvolution(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int stride_w, int stride_h, int dilation_w, int dilation_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int outw = top_blob.w;
    const int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias = bias_data.empty() ? 0.f : bias_data[p];

        out.fill(bias);

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int inch = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < h; i++)
        {
            for (int j = 0; j < w; j++)
            {
                float* outptr = out.row(i * stride_h) + j * stride_w;

                const float* kptr = (const float*)weight_data + maxk * inch * p;

                for (int q = 0; q < inch; q++)
                {
                    const float val = bottom_blob.channel(q).row(i)[j];

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[space_ofs[k]] += val * w;
                    }

                    kptr += maxk;
                }
            }
        }

        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
            }
        }
    }

    return 0;
}